

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_buffer_sizes.c
# Opt level: O0

int check_block_sizes(test_state *state)

{
  int iVar1;
  long in_RDI;
  int status;
  int bs;
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_14 = 8;
  while( true ) {
    if (0x40 < local_14) {
      return 0;
    }
    *(int *)(*(long *)(in_RDI + 0x58) + 0x34) = local_14;
    *(int *)(*(long *)(in_RDI + 0x58) + 0x38) =
         (int)(*(ulong *)(in_RDI + 0x30) / (ulong)(long)(local_14 * *(int *)(in_RDI + 0xc)));
    iVar1 = encode_decode_large((test_state *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar1 != 0) break;
    local_14 = local_14 << 1;
  }
  return iVar1;
}

Assistant:

int check_block_sizes(struct test_state *state)
{
    int bs, status;

    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;
        state->strm->rsi = (int)(state->buf_len
                                 / (bs * state->bytes_per_sample));

        status = encode_decode_large(state);
        if (status)
            return status;
    }
    return 0;
}